

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O0

void ResizeCountMintermPages(void)

{
  double **ppdVar1;
  double **newMintermPages;
  int i;
  
  page = page + 1;
  ppdVar1 = mintermPages;
  if (page == maxPages) {
    ppdVar1 = (double **)malloc((long)(maxPages + 0x80) << 3);
    if (ppdVar1 == (double **)0x0) {
      for (newMintermPages._4_4_ = 0; newMintermPages._4_4_ < page;
          newMintermPages._4_4_ = newMintermPages._4_4_ + 1) {
        if (mintermPages[newMintermPages._4_4_] != (double *)0x0) {
          free(mintermPages[newMintermPages._4_4_]);
          mintermPages[newMintermPages._4_4_] = (double *)0x0;
        }
      }
      if (mintermPages != (double **)0x0) {
        free(mintermPages);
        mintermPages = (double **)0x0;
      }
      memOut = 1;
      return;
    }
    for (newMintermPages._4_4_ = 0; newMintermPages._4_4_ < maxPages;
        newMintermPages._4_4_ = newMintermPages._4_4_ + 1) {
      ppdVar1[newMintermPages._4_4_] = mintermPages[newMintermPages._4_4_];
    }
    maxPages = maxPages + 0x80;
    if (mintermPages != (double **)0x0) {
      free(mintermPages);
    }
  }
  mintermPages = ppdVar1;
  currentMintermPage = (double *)malloc((long)pageSize << 3);
  mintermPages[page] = currentMintermPage;
  if (currentMintermPage == (double *)0x0) {
    for (newMintermPages._4_4_ = 0; newMintermPages._4_4_ < page;
        newMintermPages._4_4_ = newMintermPages._4_4_ + 1) {
      if (mintermPages[newMintermPages._4_4_] != (double *)0x0) {
        free(mintermPages[newMintermPages._4_4_]);
        mintermPages[newMintermPages._4_4_] = (double *)0x0;
      }
    }
    if (mintermPages != (double **)0x0) {
      free(mintermPages);
      mintermPages = (double **)0x0;
    }
    memOut = 1;
  }
  else {
    pageIndex = 0;
  }
  return;
}

Assistant:

static void
ResizeCountMintermPages(void)
{
    int i;
    double **newMintermPages;

    page++;
    /* If the current page index is larger than the number of pages
     * allocated, allocate a new page array. Page numbers are incremented by
     * INITIAL_PAGES
     */
    if (page == maxPages) {
        newMintermPages = ABC_ALLOC(double *,maxPages + INITIAL_PAGES);
        if (newMintermPages == NULL) {
            for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
            ABC_FREE(mintermPages);
            memOut = 1;
            return;
        } else {
            for (i = 0; i < maxPages; i++) {
                newMintermPages[i] = mintermPages[i];
            }
            /* Increase total page count */
            maxPages += INITIAL_PAGES;
            ABC_FREE(mintermPages);
            mintermPages = newMintermPages;
        }
    }
    /* Allocate a new page */
    currentMintermPage = mintermPages[page] = ABC_ALLOC(double,pageSize);
    if (currentMintermPage == NULL) {
        for (i = 0; i < page; i++) ABC_FREE(mintermPages[i]);
        ABC_FREE(mintermPages);
        memOut = 1;
        return;
    }
    /* reset page index */
    pageIndex = 0;
    return;

}